

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall Clasp::SharedContext::addBinary(SharedContext *this,Literal x,Literal y)

{
  bool bVar1;
  undefined4 in_EDX;
  uint32 in_ESI;
  Result RVar2;
  Literal lits [2];
  undefined8 in_stack_ffffffffffffff98;
  SharedContext *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  uint32 flags;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Solver *in_stack_ffffffffffffffc0;
  ClauseRep local_38;
  ClauseHead *local_28;
  Status local_20;
  Literal local_18;
  undefined4 local_14;
  undefined4 local_8;
  uint32 local_4;
  
  flags = (uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = in_EDX;
  local_4 = in_ESI;
  bVar1 = allowImplicit(in_stack_ffffffffffffffa0,
                        (ConstraintType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (!bVar1) {
    Potassco::fail(-2,"bool Clasp::SharedContext::addBinary(Literal, Literal)",0x3d4,
                   "allowImplicit(Constraint_t::Static)",(char *)0x0);
  }
  local_18.rep_ = local_4;
  local_14 = local_8;
  master((SharedContext *)0x1d5584);
  ConstraintInfo::ConstraintInfo((ConstraintInfo *)&stack0xffffffffffffffc4,Static);
  ClauseRep::ClauseRep(&local_38,&local_18,2,false,(ConstraintInfo *)&stack0xffffffffffffffc4);
  RVar2 = ClauseCreator::create
                    (in_stack_ffffffffffffffc0,
                     (ClauseRep *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     flags);
  local_28 = RVar2.local;
  local_20 = RVar2.status;
  bVar1 = ClauseCreator::Result::operator_cast_to_bool((Result *)0x1d55f9);
  return bVar1;
}

Assistant:

bool SharedContext::addBinary(Literal x, Literal y) {
	POTASSCO_REQUIRE(allowImplicit(Constraint_t::Static));
	Literal lits[2] = {x, y};
	return ClauseCreator::create(*master(), ClauseRep(lits, 2), ClauseCreator::clause_force_simplify);
}